

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

int __thiscall llvm::StringRef::compare(StringRef *this,StringRef RHS)

{
  char *Lhs;
  int iVar1;
  unsigned_long *puVar2;
  int Res;
  StringRef *this_local;
  StringRef RHS_local;
  
  RHS_local.Data = (char *)RHS.Length;
  Lhs = this->Data;
  puVar2 = std::min<unsigned_long>(&this->Length,(unsigned_long *)&RHS_local);
  iVar1 = compareMemory(Lhs,RHS.Data,*puVar2);
  if (iVar1 == 0) {
    if ((char *)this->Length == RHS_local.Data) {
      RHS_local.Length._4_4_ = 0;
    }
    else {
      RHS_local.Length._4_4_ = 1;
      if ((char *)this->Length < RHS_local.Data) {
        RHS_local.Length._4_4_ = -1;
      }
    }
  }
  else {
    RHS_local.Length._4_4_ = 1;
    if (iVar1 < 0) {
      RHS_local.Length._4_4_ = -1;
    }
  }
  return RHS_local.Length._4_4_;
}

Assistant:

LLVM_NODISCARD
    int compare(StringRef RHS) const {
      // Check the prefix for a mismatch.
      if (int Res = compareMemory(Data, RHS.Data, std::min(Length, RHS.Length)))
        return Res < 0 ? -1 : 1;

      // Otherwise the prefixes match, so we only need to check the lengths.
      if (Length == RHS.Length)
        return 0;
      return Length < RHS.Length ? -1 : 1;
    }